

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Type * enum_specifier(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Parser *ty_00;
  char *name_00;
  int64_t iVar2;
  C_VarScope *pCVar3;
  C_VarScope *sc;
  char *name;
  int val;
  int i;
  C_Type *ty_1;
  C_Token *tag;
  C_Type *ty;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  ty = (C_Type *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  ty_00 = (C_Parser *)C_enum_type(parser);
  ty_1 = (C_Type *)0x0;
  if (ty->kind == TY_VOID) {
    ty_1 = ty;
    ty = *(C_Type **)&ty->align;
  }
  if ((ty_1 == (C_Type *)0x0) || (_Var1 = C_equal((C_Token *)ty,"{"), _Var1)) {
    ty = (C_Type *)C_skip((C_Parser *)rest_local,(C_Token *)ty,"{");
    name._4_4_ = 0;
    name._0_4_ = 0;
    while (_Var1 = consume_end((C_Token **)tok_local,(C_Token *)ty), ((_Var1 ^ 0xffU) & 1) != 0) {
      if (0 < name._4_4_) {
        ty = (C_Type *)C_skip((C_Parser *)rest_local,(C_Token *)ty,",");
      }
      name_00 = get_ident((C_Parser *)rest_local,(C_Token *)ty);
      ty = *(C_Type **)&ty->align;
      _Var1 = C_equal((C_Token *)ty,"=");
      if (_Var1) {
        iVar2 = C_const_expr((C_Parser *)rest_local,(C_Token **)&ty,*(C_Token **)&ty->align);
        name._0_4_ = (int)iVar2;
      }
      pCVar3 = push_scope((C_Parser *)rest_local,name_00);
      pCVar3->enum_ty = (C_Type *)ty_00;
      pCVar3->enum_val = (int)name;
      name._0_4_ = (int)name + 1;
      name._4_4_ = name._4_4_ + 1;
    }
    parser_local = ty_00;
    if (ty_1 != (C_Type *)0x0) {
      push_tag_scope((C_Parser *)rest_local,(C_Token *)ty_1,(C_Type *)ty_00);
    }
  }
  else {
    parser_local = (C_Parser *)find_tag((C_Parser *)rest_local,(C_Token *)ty_1);
    if (parser_local == (C_Parser *)0x0) {
      C_error_tok((C_Parser *)rest_local,(C_Token *)ty_1,"unknown enum type");
    }
    if (parser_local->file_no != TY_ENUM) {
      C_error_tok((C_Parser *)rest_local,(C_Token *)ty_1,"not an enum tag");
    }
    *(C_Type **)tok_local = ty;
  }
  return (C_Type *)parser_local;
}

Assistant:

static C_Type *enum_specifier(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Type *ty = C_enum_type(parser);

  // Read a struct tag.
  C_Token *tag = NULL;
  if (tok->kind == TK_IDENT) {
    tag = tok;
    tok = tok->next;
  }

  if (tag && !C_equal(tok, "{")) {
    C_Type *ty = find_tag(parser, tag);
    if (!ty)
      C_error_tok(parser, tag, "unknown enum type");
    if (ty->kind != TY_ENUM)
      C_error_tok(parser, tag, "not an enum tag");
    *rest = tok;
    return ty;
  }

  tok = C_skip(parser, tok, "{");

  // Read an enum-list.
  int i = 0;
  int val = 0;
  while (!consume_end(rest, tok)) {
    if (i++ > 0)
      tok = C_skip(parser, tok, ",");

    char *name = get_ident(parser, tok);
    tok = tok->next;

    if (C_equal(tok, "="))
      val = C_const_expr(parser, &tok, tok->next);

    C_VarScope *sc = push_scope(parser, name);
    sc->enum_ty = ty;
    sc->enum_val = val++;
  }

  if (tag)
    push_tag_scope(parser, tag, ty);
  return ty;
}